

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenproblem_solvers.cpp
# Opt level: O2

Vector<float> __thiscall
geometrycentral::largestEigenvector<float>
          (geometrycentral *this,SparseMatrix<float> *energyMatrix,SparseMatrix<float> *massMatrix,
          size_t nIterations)

{
  void *pvVar1;
  Index extraout_RDX;
  bool bVar2;
  Vector<float> VVar3;
  Vector<float> u;
  PositiveDefiniteSolver<float> solver;
  void *local_80 [2];
  DenseStorage<float,__1,__1,_1,_0> local_70;
  SparseMatrix<float> *local_60;
  DenseStorage<float,__1,__1,_1,_0> *local_58;
  PositiveDefiniteSolver<float> local_50;
  
  pvVar1 = (void *)massMatrix->m_innerSize;
  PositiveDefiniteSolver<float>::PositiveDefiniteSolver(&local_50,massMatrix);
  local_80[0] = pvVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_70,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)local_80);
  Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,_1,_0> *)this,&local_70);
  while (bVar2 = nIterations != 0, nIterations = nIterations - 1, bVar2) {
    local_60 = energyMatrix;
    local_58 = &local_70;
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_80,
               (DenseBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
                *)&local_60);
    PositiveDefiniteSolver<float>::solve(&local_50,(Vector<float> *)this,(Vector<float> *)local_80);
    Eigen::internal::handmade_aligned_free(local_80[0]);
    anon_unknown_1::normalize<float>((Vector<float> *)this,massMatrix);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              ((Matrix<float,__1,_1,_0,__1,_1> *)&local_70,(Matrix<float,__1,_1,_0,__1,_1> *)this);
  }
  Eigen::internal::handmade_aligned_free(local_70.m_data);
  PositiveDefiniteSolver<float>::~PositiveDefiniteSolver(&local_50);
  VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (Vector<float>)
         VVar3.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector<T> largestEigenvector(SparseMatrix<T>& energyMatrix, SparseMatrix<T>& massMatrix, size_t nIterations) {

  size_t N = massMatrix.rows();
  PositiveDefiniteSolver<T> solver(massMatrix);

  Vector<T> u = Vector<T>::Random(N);
  Vector<T> x = u;
  for (size_t iIter = 0; iIter < nIterations; iIter++) {
    solver.solve(x, energyMatrix * u);
    normalize(x, massMatrix);
    u = x;
  }

  return x;
}